

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

Decorator * ftxui::operator|(Decorator *__return_storage_ptr__,Decorator *a,Decorator *b)

{
  _Invoker_type p_Var1;
  _Manager_type p_Var2;
  _Invoker_type p_Var3;
  undefined8 *puVar4;
  _Any_data local_a8;
  _Manager_type local_98;
  _Invoker_type p_Stack_90;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type p_Stack_70;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type p_Stack_30;
  
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (_Manager_type)0x0;
  p_Var1 = a->_M_invoker;
  p_Var2 = (a->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_88._M_unused._0_8_ = (undefined8)*(undefined8 *)&(a->super__Function_base)._M_functor;
    local_88._8_8_ = *(undefined8 *)((long)&(a->super__Function_base)._M_functor + 8);
    (a->super__Function_base)._M_manager = (_Manager_type)0x0;
    a->_M_invoker = (_Invoker_type)0x0;
    local_78 = p_Var2;
  }
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (_Manager_type)0x0;
  p_Var3 = b->_M_invoker;
  p_Var2 = (b->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_a8._M_unused._0_8_ = (undefined8)*(undefined8 *)&(b->super__Function_base)._M_functor;
    local_a8._8_8_ = *(undefined8 *)((long)&(b->super__Function_base)._M_functor + 8);
    (b->super__Function_base)._M_manager = (_Manager_type)0x0;
    b->_M_invoker = (_Invoker_type)0x0;
    local_98 = p_Var2;
  }
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (_Manager_type)0x0;
  p_Stack_70 = p_Var1;
  if (local_78 != (_Manager_type)0x0) {
    local_68._M_unused._M_object = local_88._M_unused._M_object;
    local_68._8_8_ = local_88._8_8_;
    local_58 = local_78;
    local_78 = (_Manager_type)0x0;
    p_Stack_70 = (_Invoker_type)0x0;
  }
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (_Manager_type)0x0;
  p_Stack_90 = p_Var3;
  if (local_98 != (_Manager_type)0x0) {
    local_48._M_unused._M_object = local_a8._M_unused._M_object;
    local_48._8_8_ = local_a8._8_8_;
    local_38 = local_98;
    local_98 = (_Manager_type)0x0;
    p_Stack_90 = (_Invoker_type)0x0;
  }
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  p_Stack_50 = p_Var1;
  p_Stack_30 = p_Var3;
  puVar4 = (undefined8 *)operator_new(0x40);
  *puVar4 = 0;
  puVar4[1] = 0;
  puVar4[2] = 0;
  puVar4[3] = p_Var1;
  if (local_58 != (_Manager_type)0x0) {
    *puVar4 = local_68._M_unused._M_object;
    puVar4[1] = local_68._8_8_;
    puVar4[2] = local_58;
    local_58 = (_Manager_type)0x0;
    p_Stack_50 = (_Invoker_type)0x0;
  }
  puVar4[4] = 0;
  puVar4[5] = 0;
  puVar4[6] = 0;
  puVar4[7] = p_Var3;
  if (local_38 != (_Manager_type)0x0) {
    puVar4[4] = local_48._M_unused._M_object;
    puVar4[5] = local_48._8_8_;
    puVar4[6] = local_38;
    local_38 = (_Manager_type)0x0;
    p_Stack_30 = (_Invoker_type)0x0;
  }
  *(undefined8 **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar4;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ArthurSonzogni[P]ftxui-starter/build_O1/_deps/ftxui-src/src/ftxui/dom/util.cpp:22:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ArthurSonzogni[P]ftxui-starter/build_O1/_deps/ftxui-src/src/ftxui/dom/util.cpp:22:10)>
       ::_M_manager;
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_98 != (_Manager_type)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

Decorator operator|(Decorator a, Decorator b) {
  return compose(std::move(a),  //
                 std::move(b));
}